

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# final_contours_extract_features.cpp
# Opt level: O0

void thresh_callback(int param_1,void *param_2)

{
  allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> *this;
  allocator<cv::Rect_<int>_> *this_00;
  allocator<cv::Point_<float>_> *paVar1;
  allocator<float> *this_01;
  allocator<cv::Mat> *this_02;
  allocator<cv::Moments> *this_03;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  float *pfVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  double dVar17;
  reference this_04;
  ostream *poVar18;
  _InputArray *p_Var19;
  float local_100c;
  float local_fcc;
  vector<int,_std::allocator<int>_> local_f38;
  _InputArray local_f20;
  allocator<char> local_f01;
  string local_f00 [32];
  _InputArray local_ee0;
  allocator<char> local_ec1;
  string local_ec0 [32];
  _OutputArray local_ea0;
  _InputArray local_e88;
  _InputArray local_e70;
  vector<int,_std::allocator<int>_> local_e58;
  _InputArray local_e40;
  allocator<char> local_e21;
  string local_e20 [39];
  allocator<char> local_df9;
  string local_df8 [39];
  allocator<char> local_dd1;
  string local_dd0 [32];
  string local_db0 [32];
  Mat local_d90;
  undefined1 local_d30 [16];
  _InputOutputArray local_d20;
  undefined1 local_d08 [8];
  Scalar color;
  size_t i_1;
  MatExpr local_cd8 [352];
  undefined1 local_b78 [8];
  Mat overlap;
  MatExpr local_b10 [352];
  undefined1 local_9b0 [8];
  Mat drawing;
  _InputArray local_948;
  _InputArray local_930 [8];
  _InputArray local_870;
  Mat local_858;
  _InputArray local_7f8;
  undefined1 local_7e0 [40];
  Mat local_7b8;
  _InputArray local_758;
  ulong local_740;
  size_t i;
  undefined1 local_730;
  char acStack_72f [3];
  char str2 [5];
  char str1 [7];
  char destname [30];
  uint local_6fc;
  MatExpr local_6f8 [4];
  int count_contours;
  undefined1 local_598 [8];
  Mat area1;
  Mat cropped;
  undefined1 local_378 [8];
  Mat area;
  undefined1 local_310 [8];
  vector<cv::Moments,_std::allocator<cv::Moments>_> mu;
  undefined1 local_2f0 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  undefined1 local_2d0 [8];
  vector<float,_std::allocator<float>_> radius;
  undefined1 local_2b0 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> center_contours;
  undefined1 local_290 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> center;
  undefined1 local_270 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boundRect;
  undefined1 local_250 [8];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours_poly;
  _OutputArray local_230;
  _OutputArray local_218;
  _InputArray local_200;
  vector<int,_std::allocator<int>_> local_1e8;
  _InputArray local_1c8;
  allocator<char> local_1a9;
  string local_1a8 [32];
  _InputArray local_188;
  allocator<char> local_169;
  string local_168 [32];
  _OutputArray local_148;
  double local_130;
  _InputArray local_128;
  double local_110;
  _InputArray local_108;
  _InputArray local_e0;
  float local_c4;
  undefined1 local_c0 [4];
  float minArea;
  vector<cv::Mat,_std::allocator<cv::Mat>_> contourRegion;
  vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> hierarchy;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  Mat threshold_output;
  void *param_2_local;
  int param_1_local;
  
  cv::Mat::Mat((Mat *)&contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)&hierarchy.super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>::vector
            ((vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *)
             &contourRegion.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_c0);
  local_c4 = 1500.0;
  cv::_InputArray::_InputArray(&local_e0,&src_gray);
  local_110 = 10.0;
  cv::_InputArray::_InputArray(&local_108,&local_110);
  local_130 = 100.0;
  cv::_InputArray::_InputArray(&local_128,&local_130);
  cv::_OutputArray::_OutputArray
            (&local_148,
             (Mat *)&contours.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::inRange(&local_e0,&local_108,&local_128,&local_148);
  cv::_OutputArray::~_OutputArray(&local_148);
  cv::_InputArray::~_InputArray(&local_128);
  cv::_InputArray::~_InputArray(&local_108);
  cv::_InputArray::~_InputArray(&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"thresh",&local_169);
  cv::_InputArray::_InputArray
            (&local_188,
             (Mat *)&contours.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::imshow(local_168,&local_188);
  cv::_InputArray::~_InputArray(&local_188);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"middle.jpg",&local_1a9);
  cv::_InputArray::_InputArray
            (&local_1c8,
             (Mat *)&contours.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1e8);
  cv::imwrite(local_1a8,&local_1c8,(vector *)&local_1e8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_1e8);
  cv::_InputArray::~_InputArray(&local_1c8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  cv::_InputArray::_InputArray
            (&local_200,
             (Mat *)&contours.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_OutputArray::_OutputArray<cv::Point_<int>>
            (&local_218,
             (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              *)&hierarchy.super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_OutputArray::_OutputArray<cv::Vec<int,4>>
            (&local_230,
             (vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *)
             &contourRegion.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::Point_<int>::Point_
            ((Point_<int> *)
             &contours_poly.
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0);
  cv::findContours(&local_200,&local_218,&local_230,3,2,
                   &contours_poly.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_OutputArray::~_OutputArray(&local_230);
  cv::_OutputArray::~_OutputArray(&local_218);
  cv::_InputArray::~_InputArray(&local_200);
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  this = (allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> *)
         ((long)&boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>::allocator(this);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)local_250,sVar10,this);
  std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>::~allocator
            ((allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> *)
             ((long)&boundRect.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  this_00 = (allocator<cv::Rect_<int>_> *)
            ((long)&center.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cv::Rect_<int>_>::allocator(this_00);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_270,sVar10,this_00);
  std::allocator<cv::Rect_<int>_>::~allocator
            ((allocator<cv::Rect_<int>_> *)
             ((long)&center.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  paVar1 = (allocator<cv::Point_<float>_> *)
           ((long)&center_contours.
                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cv::Point_<float>_>::allocator(paVar1);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_290,sVar10,
             paVar1);
  std::allocator<cv::Point_<float>_>::~allocator
            ((allocator<cv::Point_<float>_> *)
             ((long)&center_contours.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  paVar1 = (allocator<cv::Point_<float>_> *)
           ((long)&radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cv::Point_<float>_>::allocator(paVar1);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_2b0,sVar10,
             paVar1);
  std::allocator<cv::Point_<float>_>::~allocator
            ((allocator<cv::Point_<float>_> *)
             ((long)&radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  this_01 = (allocator<float> *)
            ((long)&images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(this_01);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_2d0,sVar10,this_01);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  this_02 = (allocator<cv::Mat> *)
            ((long)&mu.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<cv::Mat>::allocator(this_02);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_2f0,sVar10,this_02);
  std::allocator<cv::Mat>::~allocator
            ((allocator<cv::Mat> *)
             ((long)&mu.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  this_03 = (allocator<cv::Moments> *)((long)area.step.buf + 0xf);
  std::allocator<cv::Moments>::allocator(this_03);
  std::vector<cv::Moments,_std::allocator<cv::Moments>_>::vector
            ((vector<cv::Moments,_std::allocator<cv::Moments>_> *)local_310,sVar10,this_03);
  std::allocator<cv::Moments>::~allocator((allocator<cv::Moments> *)((long)area.step.buf + 0xf));
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  cv::Mat::zeros((int)&cropped + 0x58,(int)sVar10,2);
  cv::MatExpr::operator_cast_to_Mat((Mat *)local_378,(MatExpr *)(cropped.step.buf + 1));
  cv::MatExpr::~MatExpr((MatExpr *)(cropped.step.buf + 1));
  cv::Mat::Mat((Mat *)(area1.step.buf + 1));
  sVar10 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)&hierarchy.
                      super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  cv::Mat::zeros((int)local_6f8,(int)sVar10,2);
  cv::MatExpr::operator_cast_to_Mat((Mat *)local_598,local_6f8);
  cv::MatExpr::~MatExpr(local_6f8);
  if ((thresh_callback(int,void*)::oss_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&thresh_callback(int,void*)::oss_abi_cxx11_), iVar7 != 0)) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&thresh_callback(int,void*)::oss_abi_cxx11_);
    __cxa_atexit(std::__cxx11::stringstream::~stringstream,
                 &thresh_callback(int,void*)::oss_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&thresh_callback(int,void*)::oss_abi_cxx11_);
  }
  local_6fc = 0;
  memset(str2 + 4,0,0x1e);
  _acStack_72f = 0x75736572;
  str2[1] = 'l';
  str2[2] = 't';
  str2[3] = '\0';
  i._4_4_ = 0x67706a2e;
  local_730 = 0;
  for (local_740 = 0; uVar6 = local_740,
      sVar10 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       *)&hierarchy.
                          super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage), uVar6 < sVar10;
      local_740 = local_740 + 1) {
    pvVar11 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            *)&hierarchy.
                               super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_740);
    cv::Mat::Mat<cv::Point_<int>>(&local_7b8,pvVar11,false);
    cv::_InputArray::_InputArray(&local_758,&local_7b8);
    pvVar11 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            *)local_250,local_740);
    cv::_OutputArray::_OutputArray<cv::Point_<int>>((_OutputArray *)(local_7e0 + 0x10),pvVar11);
    cv::approxPolyDP(&local_758,(_OutputArray *)(local_7e0 + 0x10),3.0,true);
    cv::_OutputArray::~_OutputArray((_OutputArray *)(local_7e0 + 0x10));
    cv::_InputArray::~_InputArray(&local_758);
    cv::Mat::~Mat(&local_7b8);
    pvVar11 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            *)local_250,local_740);
    cv::Mat::Mat<cv::Point_<int>>(&local_858,pvVar11,false);
    cv::_InputArray::_InputArray(&local_7f8,&local_858);
    cv::boundingRect((_InputArray *)local_7e0);
    pvVar12 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                        ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_270,
                         local_740);
    cv::Rect_<int>::operator=(pvVar12,(Rect_<int> *)local_7e0);
    cv::_InputArray::~_InputArray(&local_7f8);
    cv::Mat::~Mat(&local_858);
    local_fcc = (float)local_740;
    pfVar13 = cv::Mat::at<float>((Mat *)local_378,(int)local_740,0);
    *pfVar13 = local_fcc;
    pvVar12 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                        ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_270,
                         local_740);
    iVar7 = pvVar12->width;
    pvVar12 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                        ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_270,
                         local_740);
    iVar8 = pvVar12->height;
    pfVar13 = cv::Mat::at<float>((Mat *)local_378,(int)local_740,1);
    *pfVar13 = (float)iVar7 * (float)iVar8;
    pvVar11 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            *)local_250,local_740);
    cv::_InputArray::_InputArray<cv::Point_<int>>(&local_870,pvVar11);
    pvVar14 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                        ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_290
                         ,local_740);
    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_2d0,local_740);
    cv::minEnclosingCircle(&local_870,(Point_ *)pvVar14,pvVar15);
    cv::_InputArray::~_InputArray(&local_870);
    local_100c = (float)local_740;
    pfVar13 = cv::Mat::at<float>((Mat *)local_598,(int)local_740,0);
    *pfVar13 = local_100c;
    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_2d0,local_740);
    fVar2 = *pvVar15;
    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_2d0,local_740);
    fVar3 = *pvVar15;
    pfVar13 = cv::Mat::at<float>((Mat *)local_598,(int)local_740,1);
    *pfVar13 = fVar2 * fVar3;
    pvVar11 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                            *)local_250,local_740);
    cv::_InputArray::_InputArray<cv::Point_<int>>(&local_948,pvVar11);
    cv::moments(local_930,SUB81(&local_948,0));
    pvVar16 = std::vector<cv::Moments,_std::allocator<cv::Moments>_>::operator[]
                        ((vector<cv::Moments,_std::allocator<cv::Moments>_> *)local_310,local_740);
    memcpy(pvVar16,local_930,0xc0);
    cv::_InputArray::~_InputArray(&local_948);
    pvVar16 = std::vector<cv::Moments,_std::allocator<cv::Moments>_>::operator[]
                        ((vector<cv::Moments,_std::allocator<cv::Moments>_> *)local_310,local_740);
    dVar4 = *(double *)(pvVar16 + 8);
    pvVar16 = std::vector<cv::Moments,_std::allocator<cv::Moments>_>::operator[]
                        ((vector<cv::Moments,_std::allocator<cv::Moments>_> *)local_310,local_740);
    dVar17 = *(double *)pvVar16;
    pvVar16 = std::vector<cv::Moments,_std::allocator<cv::Moments>_>::operator[]
                        ((vector<cv::Moments,_std::allocator<cv::Moments>_> *)local_310,local_740);
    dVar5 = *(double *)(pvVar16 + 0x10);
    pvVar16 = std::vector<cv::Moments,_std::allocator<cv::Moments>_>::operator[]
                        ((vector<cv::Moments,_std::allocator<cv::Moments>_> *)local_310,local_740);
    cv::Point_<float>::Point_
              ((Point_<float> *)(drawing.step.buf + 1),(float)(dVar4 / dVar17),
               (float)(dVar5 / *(double *)pvVar16));
    pvVar14 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                        ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_2b0
                         ,local_740);
    cv::Point_<float>::operator=(pvVar14,(Point_<float> *)(drawing.step.buf + 1));
  }
  cv::MatSize::operator()((MatSize *)(overlap.step.buf + 1));
  cv::Mat::zeros(local_b10,overlap.step.buf + 1,0x10);
  cv::MatExpr::operator_cast_to_Mat((Mat *)local_9b0,local_b10);
  cv::MatExpr::~MatExpr(local_b10);
  cv::MatSize::operator()((MatSize *)&i_1);
  cv::Mat::zeros(local_cd8,&i_1,0x10);
  cv::MatExpr::operator_cast_to_Mat((Mat *)local_b78,local_cd8);
  cv::MatExpr::~MatExpr(local_cd8);
  for (color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      dVar4 = color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3],
      dVar17 = (double)std::
                       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               *)&hierarchy.
                                  super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage),
      (ulong)dVar4 < (ulong)dVar17;
      color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
           (double)((long)color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] + 1)) {
    iVar7 = cv::RNG::uniform(&rng,0,0xff);
    iVar8 = cv::RNG::uniform(&rng,0,0xff);
    iVar9 = cv::RNG::uniform(&rng,0,0xff);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)local_d08,(double)iVar7,(double)iVar8,(double)iVar9,0.0);
    pfVar13 = cv::Mat::at<float>((Mat *)local_378,
                                 color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._0_4_,1)
    ;
    if (local_c4 < *pfVar13) {
      cv::_InputOutputArray::_InputOutputArray(&local_d20,(Mat *)local_9b0);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_270,
                 (size_type)color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]);
      cv::Rect_<int>::tl((Rect_<int> *)(local_d30 + 8));
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_270,
                 (size_type)color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]);
      cv::Rect_<int>::br((Rect_<int> *)local_d30);
      cv::rectangle(&local_d20,local_d30 + 8,local_d30,local_d08,2,8,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_d20);
      pvVar12 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                          ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_270,
                           (size_type)color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]);
      cv::Mat::operator()(&local_d90,&src,pvVar12);
      this_04 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_2f0,
                           (size_type)color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]);
      cv::Mat::operator=(this_04,&local_d90);
      cv::Mat::~Mat(&local_d90);
      local_6fc = local_6fc + 1;
      poVar18 = std::operator<<((ostream *)&DAT_00117390,acStack_72f);
      poVar18 = (ostream *)
                std::ostream::operator<<
                          (poVar18,(ulong)color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]
                          );
      std::operator<<(poVar18,(char *)((long)&i + 4));
      std::__cxx11::stringstream::str();
      poVar18 = std::operator<<((ostream *)&std::cout,local_db0);
      std::ostream::operator<<(poVar18,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_db0);
      std::ios::clear((long)&thresh_callback(int,void*)::oss_abi_cxx11_ +
                      *(long *)(thresh_callback(int,void*)::oss_abi_cxx11_ + -0x18),0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_dd0,"",&local_dd1);
      std::__cxx11::stringstream::str((string *)&thresh_callback(int,void*)::oss_abi_cxx11_);
      std::__cxx11::string::~string(local_dd0);
      std::allocator<char>::~allocator(&local_dd1);
    }
  }
  printf("count %d\n",(ulong)local_6fc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_df8,"Contours",&local_df9);
  cv::namedWindow(local_df8,1);
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator(&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e20,"contours_.jpg",&local_e21);
  cv::_InputArray::_InputArray(&local_e40,(Mat *)local_9b0);
  local_e58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_e58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_e58);
  cv::imwrite(local_e20,&local_e40,(vector *)&local_e58);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e58);
  cv::_InputArray::~_InputArray(&local_e40);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator(&local_e21);
  cv::_InputArray::_InputArray(&local_e70,&src);
  cv::_InputArray::_InputArray(&local_e88,(Mat *)local_9b0);
  cv::_OutputArray::_OutputArray(&local_ea0,(Mat *)local_b78);
  p_Var19 = (_InputArray *)cv::noArray();
  cv::add(&local_e70,&local_e88,&local_ea0,p_Var19,-1);
  cv::_OutputArray::~_OutputArray(&local_ea0);
  cv::_InputArray::~_InputArray(&local_e88);
  cv::_InputArray::~_InputArray(&local_e70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ec0,"Contours",&local_ec1);
  cv::_InputArray::_InputArray(&local_ee0,(Mat *)local_b78);
  cv::imshow(local_ec0,&local_ee0);
  cv::_InputArray::~_InputArray(&local_ee0);
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::~allocator(&local_ec1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f00,"overlap.jpg",&local_f01);
  cv::_InputArray::_InputArray(&local_f20,(Mat *)local_b78);
  local_f38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_f38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_f38);
  cv::imwrite(local_f00,&local_f20,(vector *)&local_f38);
  std::vector<int,_std::allocator<int>_>::~vector(&local_f38);
  cv::_InputArray::~_InputArray(&local_f20);
  std::__cxx11::string::~string(local_f00);
  std::allocator<char>::~allocator(&local_f01);
  cv::Mat::~Mat((Mat *)local_b78);
  cv::Mat::~Mat((Mat *)local_9b0);
  cv::Mat::~Mat((Mat *)local_598);
  cv::Mat::~Mat((Mat *)(area1.step.buf + 1));
  cv::Mat::~Mat((Mat *)local_378);
  std::vector<cv::Moments,_std::allocator<cv::Moments>_>::~vector
            ((vector<cv::Moments,_std::allocator<cv::Moments>_> *)local_310);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_2f0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_2d0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_2b0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_290);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_270);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_250);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_c0);
  std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>::~vector
            ((vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *)
             &contourRegion.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)&hierarchy.super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)&contours.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void thresh_callback(int, void* )
{
  Mat threshold_output;
  vector<vector<Point> > contours;
  vector<Vec4i> hierarchy;
  vector<Mat> contourRegion;
  float minArea= 1500.0;  // threshold for area-wise cleanup
  /// Detect edges using Threshold for user thresh i/p
// threshold( src_gray, threshold_output, thresh, 255, THRESH_BINARY );
	//adaptiveThreshold(src_gray, threshold_output, 255, ADAPTIVE_THRESH_GAUSSIAN_C, CV_THRESH_BINARY, 151, 0);
 // threshold( src_gray, threshold_output, 128, 255, THRESH_BINARY );
  inRange(src_gray, 10,100, threshold_output);
  imshow("thresh", threshold_output);
  imwrite("middle.jpg", threshold_output);
  //closing operation
//  dilate(threshold_output, threshold_output, cv::Mat(), cv::Point(-1,-1),3);
//  erode(threshold_output, threshold_output, cv::Mat(), cv::Point(-1,-1),3);
//  imshow("thresh_close", threshold_output);
  
  /// Find contours
  findContours( threshold_output, contours, hierarchy, RETR_TREE, CHAIN_APPROX_SIMPLE, Point(0, 0) );
  
  //variables for drawing and extraction
  vector<vector<Point> > contours_poly( contours.size() );
  vector<Rect> boundRect( contours.size() );
  vector<Point2f>center( contours.size() );	 // centers of the enclosing circles
  vector<Point2f>center_contours( contours.size() );	 // centers of the contours
  vector<float>radius( contours.size() );  //radii of the enclosing circles
  vector<Mat>images(contours.size()); // extracted images from bounding rectangles
  vector<Moments>mu(contours.size()); // moments of the contours
 
  Mat area = Mat::zeros(contours.size(), 2, CV_32F);
  Mat cropped;
  Mat area1 = Mat::zeros(contours.size(), 2, CV_32F);
  static std:: stringstream oss;
  int count_contours =0;  // contours with area greater than minArea 
  char destname[30]= "";
  const char  str1[7] = "result";
  const char str2[5] = ".jpg";
  
  /// Approximate contours to polygons + get bounding rects and circles
  for( size_t i = 0; i < contours.size(); i++ )
     { 
		approxPolyDP( Mat(contours[i]), contours_poly[i], 3, true );
        boundRect[i] = boundingRect( Mat(contours_poly[i]) );
	    // area of rectangles
	     area.at<float>(i,0)=(float)i;
		 area.at<float>(i,1)= (float)boundRect[i].width* boundRect[i].height;
		
         minEnclosingCircle( contours_poly[i], center[i], radius[i] );
		// area of circles
	     area1.at<float>(i,0)=(float)i;
		 area1.at<float>(i,1)= (float)(radius[i]*radius[i]);

		//moments of the contour
		mu[i]= moments(contours_poly[i], false);
		
		//center of the contour
		center_contours[i]= Point2f( mu[i].m10/mu[i].m00 , mu[i].m01/mu[i].m00 );
     }


  /// Draw polygonal contour + bonding rects + circles
	  Mat drawing = Mat::zeros( threshold_output.size(), CV_8UC3 );
	  Mat overlap = Mat::zeros( threshold_output.size(), CV_8UC3 );
  for( size_t i = 0; i< contours.size(); i++ )
     {
       Scalar color = Scalar( rng.uniform(0, 255), rng.uniform(0,255), rng.uniform(0,255) );
       //drawContours( drawing, contours_poly, (int)i, color, 1, 8, vector<Vec4i>(), 0, Point() );
//  try if something else can be used for comparison  e.g contourArea/RectArea
       if(area.at<float>(i,1)> minArea)
		{	
			 //draw the rectangle
			  rectangle( drawing, boundRect[i].tl(), boundRect[i].br(), color, 2, 8, 0 );
			 //calculate moments for the contour
			 // draw the enclosing circle
             // circle( drawing, center[i], (int)radius[i], color, 2, 8, 0 );
			 
			 //mark the center of the contour
			 //circle(drawing,center_contours[i],3, Scalar(255,0,0), -1,8,0 );
			  
			  images[i]= src(boundRect[i]);
			  count_contours +=1;
			  //mark the center of the enclosing circle
			  //circle( drawing, center[i], 3, Scalar(0,255,0), -1, 8, 0 );

			//  strcpy(destname, str1); itoa((int)i, destname, 10);
			//	strcat(destname, str2);
			oss<< str1 << i<< str2;
	        cout << oss.str() << endl;
				 
			 // imshow(oss.str(), images[i]);
			  oss.clear();
			  oss.str(""); 
		}
	
			   
     }
/*	for(size_t i=0;i <contours.size();i++)
	{		
			Mat mask = Mat::zeros(src.size(), CV_8UC1);
			drawContours(mask, contours, (int)i, Scalar(255), CV_FILLED);		
			Mat imageROI;
			src.copyTo(imageROI, mask);
			contourRegion[i]= imageROI(boundRect[i]);
	}*/
		
//printing areas of rectangles
/*	for(size_t i=0;i<contours.size(); i++)
	{
			cout<< " " << area.at<float>(i,0) <<  " " << area.at<float>(i,1) << endl;
	}

//	qsort(area.data, area.rows, sizeof(area.row(0)), compareforsort);
	
	for(size_t i=0;i<contours.size(); i++)
	{
			cout<< " " << area.at<float>(i,0) <<  " " << area.at<float>(i,1) << endl;
	}*/
	printf("count %d\n", count_contours);
  /// Show in a window
  namedWindow( "Contours" );
  //imshow( "Contours", drawing );
	imwrite("contours_.jpg", drawing);
	
	add(src, drawing, overlap);
	imshow("Contours", overlap);
	imwrite("overlap.jpg", overlap);
}